

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

void duckdb_miniz::mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  mz_zip_internal_state *pmVar7;
  undefined4 *puVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  mz_uint32 t_1;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  mz_uint32 t;
  byte *pbVar27;
  byte *pbVar28;
  bool bVar29;
  
  uVar4 = pZip->m_total_files;
  uVar17 = (ulong)uVar4;
  if (1 < uVar17) {
    pmVar7 = pZip->m_pState;
    puVar8 = (undefined4 *)(pmVar7->m_sorted_central_dir_offsets).m_p;
    uVar14 = uVar4 - 2 >> 1;
    do {
      uVar15 = (ulong)uVar14;
      uVar24 = uVar15 * 2 + 1;
      if (uVar24 < uVar17) {
        pvVar9 = (pmVar7->m_central_dir).m_p;
        pvVar10 = (pmVar7->m_central_dir_offsets).m_p;
        uVar25 = uVar15;
        do {
          if (uVar25 * 2 + 2 < uVar17) {
            pvVar11 = (pmVar7->m_central_dir).m_p;
            pvVar12 = (pmVar7->m_central_dir_offsets).m_p;
            uVar21 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar24] * 4);
            uVar19 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar25 * 2 + 2] * 4);
            pbVar18 = (byte *)((long)pvVar11 + uVar21 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar11 + uVar21 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar11 + uVar19 + 0x1c);
            uVar5 = (uint)uVar3;
            if ((uint)uVar2 < (uint)uVar3) {
              uVar5 = (uint)uVar2;
            }
            pbVar28 = (byte *)((long)pvVar11 + uVar5 + uVar21 + 0x2e);
            if (uVar5 == 0) {
              bVar20 = 0;
              bVar22 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar11 + uVar19 + 0x2e);
              do {
                bVar22 = *pbVar18;
                bVar20 = bVar22 + 0x20;
                if (0x19 < (byte)(bVar22 + 0xbf)) {
                  bVar20 = bVar22;
                }
                bVar1 = *pbVar27;
                bVar22 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar22 = bVar1;
                }
                if (bVar20 != bVar22) break;
                pbVar18 = pbVar18 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar18 < pbVar28);
            }
            bVar29 = bVar20 < bVar22;
            if (pbVar18 == pbVar28) {
              bVar29 = uVar2 < uVar3;
            }
            uVar19 = (ulong)bVar29;
          }
          else {
            uVar19 = 0;
          }
          uVar19 = uVar19 + uVar24;
          uVar5 = puVar8[uVar25];
          uVar24 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar5 * 4);
          uVar21 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar8[uVar19] * 4);
          pbVar18 = (byte *)((long)pvVar9 + uVar24 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar9 + uVar24 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar9 + uVar21 + 0x1c);
          uVar13 = (uint)uVar3;
          if ((uint)uVar2 < (uint)uVar3) {
            uVar13 = (uint)uVar2;
          }
          pbVar28 = (byte *)((long)pvVar9 + uVar13 + uVar24 + 0x2e);
          if (uVar13 == 0) {
            bVar20 = 0;
            bVar22 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar9 + uVar21 + 0x2e);
            do {
              bVar22 = *pbVar18;
              bVar20 = bVar22 + 0x20;
              if (0x19 < (byte)(bVar22 + 0xbf)) {
                bVar20 = bVar22;
              }
              bVar1 = *pbVar27;
              bVar22 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar22 = bVar1;
              }
              if (bVar20 != bVar22) break;
              pbVar18 = pbVar18 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar18 < pbVar28);
          }
          bVar29 = bVar22 <= bVar20;
          if (pbVar18 == pbVar28) {
            bVar29 = uVar3 <= uVar2;
          }
          if (bVar29) break;
          puVar8[uVar25] = puVar8[uVar19];
          puVar8[uVar19] = uVar5;
          uVar24 = uVar19 * 2 + 1;
          uVar25 = uVar19;
        } while (uVar24 < uVar17);
      }
      bVar29 = uVar14 == 0;
      uVar14 = uVar14 - 1;
      if (bVar29) {
        uVar14 = 0;
      }
    } while (uVar15 != 0);
    if (uVar4 - 1 != 0) {
      uVar17 = (ulong)(uVar4 - 1);
      do {
        uVar6 = puVar8[uVar17];
        puVar8[uVar17] = *puVar8;
        *puVar8 = uVar6;
        if (1 < uVar17) {
          pvVar9 = (pmVar7->m_central_dir).m_p;
          pvVar10 = (pmVar7->m_central_dir_offsets).m_p;
          uVar24 = 1;
          lVar16 = 0;
          lVar23 = 0;
          do {
            if (lVar16 + 2U < uVar17) {
              pvVar11 = (pmVar7->m_central_dir).m_p;
              pvVar12 = (pmVar7->m_central_dir_offsets).m_p;
              uVar25 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar24] * 4);
              uVar15 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[lVar16 + 2] * 4);
              pbVar18 = (byte *)((long)pvVar11 + uVar25 + 0x2e);
              uVar2 = *(ushort *)((long)pvVar11 + uVar25 + 0x1c);
              uVar3 = *(ushort *)((long)pvVar11 + uVar15 + 0x1c);
              uVar4 = (uint)uVar3;
              if ((uint)uVar2 < (uint)uVar3) {
                uVar4 = (uint)uVar2;
              }
              pbVar28 = (byte *)((long)pvVar11 + uVar4 + uVar25 + 0x2e);
              if (uVar4 == 0) {
                bVar20 = 0;
                bVar22 = 0;
              }
              else {
                pbVar27 = (byte *)((long)pvVar11 + uVar15 + 0x2e);
                do {
                  bVar22 = *pbVar18;
                  bVar20 = bVar22 + 0x20;
                  if (0x19 < (byte)(bVar22 + 0xbf)) {
                    bVar20 = bVar22;
                  }
                  bVar1 = *pbVar27;
                  bVar22 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    bVar22 = bVar1;
                  }
                  if (bVar20 != bVar22) break;
                  pbVar18 = pbVar18 + 1;
                  pbVar27 = pbVar27 + 1;
                } while (pbVar18 < pbVar28);
              }
              bVar29 = bVar20 < bVar22;
              if (pbVar18 == pbVar28) {
                bVar29 = uVar2 < uVar3;
              }
              uVar15 = (ulong)bVar29;
            }
            else {
              uVar15 = 0;
            }
            lVar26 = uVar15 + uVar24;
            uVar4 = puVar8[lVar23];
            uVar24 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar4 * 4);
            uVar15 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar8[lVar26] * 4);
            pbVar18 = (byte *)((long)pvVar9 + uVar24 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar24 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar15 + 0x1c);
            uVar14 = (uint)uVar3;
            if ((uint)uVar2 < (uint)uVar3) {
              uVar14 = (uint)uVar2;
            }
            pbVar28 = (byte *)((long)pvVar9 + uVar14 + uVar24 + 0x2e);
            if (uVar14 == 0) {
              bVar20 = 0;
              bVar22 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar15 + 0x2e);
              do {
                bVar22 = *pbVar18;
                bVar20 = bVar22 + 0x20;
                if (0x19 < (byte)(bVar22 + 0xbf)) {
                  bVar20 = bVar22;
                }
                bVar1 = *pbVar27;
                bVar22 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar22 = bVar1;
                }
                if (bVar20 != bVar22) break;
                pbVar18 = pbVar18 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar18 < pbVar28);
            }
            bVar29 = bVar22 <= bVar20;
            if (pbVar18 == pbVar28) {
              bVar29 = uVar3 <= uVar2;
            }
            if (bVar29) break;
            puVar8[lVar23] = puVar8[lVar26];
            puVar8[lVar26] = uVar4;
            lVar16 = lVar26 * 2;
            uVar24 = lVar26 * 2 + 1;
            lVar23 = lVar26;
          } while (uVar24 < uVar17);
        }
        uVar17 = uVar17 - 1;
      } while ((int)uVar17 != 0);
    }
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array *pCentral_dir = &pState->m_central_dir;
    mz_uint32 *pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;)
    {
        mz_uint64 child, root = start;
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0)
    {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}